

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void ui::Loop(void)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  ComponentBase *pCVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer *ppsVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [8];
  undefined1 auVar13 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  element_type *peVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  pointer pGVar17;
  pointer pGVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  ulong uVar21;
  long lVar22;
  size_type __new_size;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> *__x;
  ComponentBase *this_00;
  pointer *this_01;
  pointer pGVar23;
  pointer psVar24;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l_00;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l_01;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_02;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_03;
  ConstStringListRef entries;
  Ref<ftxui::ButtonOption> option;
  vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_> groups
  ;
  Component content_renderer;
  Component menu_renderer;
  Component left_container;
  MenuOption menu_option;
  ScreenInteractive screen;
  _Any_data local_6e8;
  undefined1 local_6d8 [32];
  undefined1 local_6b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6b0;
  code *local_6a8;
  _func_int **pp_Stack_6a0;
  _Atomic_word *local_690;
  _Any_data local_688;
  _func_int **local_678;
  code *pcStack_670;
  ComponentBase *local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_660;
  vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  local_658;
  _Atomic_word *local_640;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_638;
  long local_630;
  Component local_628;
  ulong local_618;
  Color local_610;
  Color local_60c;
  Color local_608;
  Color local_604;
  Color local_600;
  Color local_5fc;
  vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  local_5f8;
  _Any_data local_5d8;
  code *local_5c8;
  code *pcStack_5c0;
  _Any_data local_5b8;
  _Manager_type local_5a8;
  code *pcStack_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  Decorator local_578;
  Component local_558;
  Component local_548;
  Component local_538;
  Component local_528;
  element_type *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_510;
  Component local_508;
  element_type *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4f0;
  element_type *local_4e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4e0;
  Component local_4d8;
  long local_4c8;
  pointer local_4c0;
  long local_4b8;
  ComponentBase *local_4b0;
  _Any_data local_4a8;
  code *local_498;
  Components local_488;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_470;
  _Any_data local_458;
  code *local_448;
  _Any_data local_438;
  code *local_428;
  _Any_data local_418;
  code *local_408;
  _Any_data local_3f8;
  code *local_3e8;
  _Any_data local_3d8;
  code *local_3c8;
  _Any_data local_3b8;
  code *local_3a8;
  _Any_data local_398;
  code *local_388;
  _Any_data local_378;
  _Manager_type local_368 [2];
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> local_358
  ;
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> local_320
  ;
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  pointer local_2e8 [8];
  undefined8 local_2a8;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_2a0;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_288;
  MenuOption local_270;
  MenuOption local_1a0;
  ScreenInteractive local_d0;
  
  ftxui::ScreenInteractive::Fullscreen();
  local_378._M_unused._M_object = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"System","");
  panel::PRU();
  panel::GPIO();
  panel::EMMC();
  panel::Led();
  panel::passwd();
  panel::ssh();
  __l._M_len = 6;
  __l._M_array = (iterator)&local_270;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(&local_358,__l,(allocator_type *)(local_6d8 + 0x20));
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Network","");
  panel::WiFi((panel *)&local_1a0,&local_d0);
  panel::ICS();
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1a0;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(&local_320,__l_00,(allocator_type *)local_4a8._M_pod_data);
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Info","");
  panel::About();
  this_01 = local_2e8;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_6e8;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector((vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> *
         )this_01,__l_01,(allocator_type *)&local_5b8);
  local_5f8.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar18 = (pointer)operator_new(0xa8);
  local_5f8.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pGVar18 + 3;
  lVar22 = 0;
  local_5f8.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = pGVar18;
  do {
    *(char **)((long)&(pGVar18->title)._M_dataplus._M_p + lVar22) =
         (pGVar18->title).field_2._M_local_buf + lVar22;
    lVar2 = *(long *)((long)local_368 + lVar22 + -0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&(pGVar18->title)._M_dataplus._M_p + lVar22),lVar2,
               *(long *)((long)local_368 + lVar22 + -8) + lVar2);
    __x = (vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
           *)((long)&local_358.
                     super__Vector_base<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar22);
    std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
    vector((vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
            *)((long)&(pGVar18->groups).
                      super__Vector_base<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar22),__x);
    lVar22 = lVar22 + 0x38;
  } while (lVar22 != 0xa8);
  local_5f8.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar18 + 3;
  lVar22 = -0xa8;
  do {
    std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
    ~vector((vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
             *)this_01);
    if ((pointer)(this_01 + -2) != this_01[-4]) {
      __x = (vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
             *)((long)&(this_01[-2]->super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 1);
      operator_delete(this_01[-4],(ulong)__x);
    }
    this_01 = this_01 + -7;
    lVar22 = lVar22 + 0x38;
  } while (lVar22 != 0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_);
  }
  lVar22 = 0x20;
  do {
    p_Var19 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_270.focused_entry.address_ + lVar22);
    if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
    }
    lVar22 = lVar22 + -0x10;
  } while (lVar22 != 0);
  lVar22 = 0x60;
  do {
    p_Var19 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_288.
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar22);
    if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
    }
    lVar22 = lVar22 + -0x10;
  } while (lVar22 != 0);
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xf0);
  pGVar17 = local_5f8.
            super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pGVar23 = local_5f8.
            super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var19->_M_use_count = 1;
  p_Var19->_M_weak_count = 1;
  p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00174c28;
  lVar22 = (long)local_5f8.
                 super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_5f8.
                 super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar18 = std::
            _Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
            ::_M_allocate((_Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                           *)((lVar22 >> 3) * 0x6db6db6db6db6db7),(size_t)__x);
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar22 + (long)pGVar18);
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_start = pGVar18;
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar18;
  for (; pGVar23 != pGVar17; pGVar23 = pGVar23 + 1) {
    (pGVar18->title)._M_dataplus._M_p = (pointer)&(pGVar18->title).field_2;
    pcVar3 = (pGVar23->title)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pGVar18,pcVar3,pcVar3 + (pGVar23->title)._M_string_length);
    std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
    vector(&pGVar18->groups,&pGVar23->groups);
    pGVar18 = pGVar18 + 1;
  }
  local_668 = (ComponentBase *)(p_Var19 + 1);
  p_Var19[2]._M_use_count = 0;
  p_Var19[2]._M_weak_count = 0;
  p_Var19[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[1]._M_use_count = 0;
  p_Var19[1]._M_weak_count = 0;
  p_Var19[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[1]._vptr__Sp_counted_base = (_func_int **)&PTR__MainMenu_00174c78;
  local_640 = &p_Var19[3]._M_use_count;
  local_638 = p_Var19 + 5;
  local_690 = &p_Var19[6]._M_use_count;
  local_660 = p_Var19 + 8;
  p_Var19[3]._M_use_count = 0;
  p_Var19[3]._M_weak_count = 0;
  p_Var19[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[4]._M_use_count = 0;
  p_Var19[4]._M_weak_count = 0;
  p_Var19[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[5]._M_use_count = 0;
  p_Var19[5]._M_weak_count = 0;
  p_Var19[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[6]._M_use_count = 0;
  p_Var19[6]._M_weak_count = 0;
  p_Var19[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[7]._M_use_count = 0;
  p_Var19[7]._M_weak_count = 0;
  p_Var19[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[8]._M_use_count = 0;
  p_Var19[8]._M_weak_count = 0;
  p_Var19[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[9]._M_use_count = 0;
  p_Var19[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[10]._M_use_count = 0;
  p_Var19[10]._M_weak_count = 0;
  p_Var19[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[0xb]._M_use_count = 0;
  p_Var19[0xb]._M_weak_count = 0;
  p_Var19[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[0xc]._M_use_count = 0;
  p_Var19[0xc]._M_weak_count = 0;
  *(undefined4 *)&p_Var19[0xd]._vptr__Sp_counted_base = 0x23;
  p_Var19[0xd]._M_use_count = 0;
  p_Var19[0xd]._M_weak_count = 0;
  p_Var19[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var19[0xe]._M_use_count = 0;
  __new_size = ((long)pGVar18 -
                (long)local_658.
                      super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_658.
  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar18;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_640,__new_size);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_638,__new_size);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::resize((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)local_690,__new_size);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::resize((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)local_660,__new_size);
  ftxui::MenuOption::MenuOption(&local_270);
  local_5b8._8_8_ = 0;
  local_5b8._M_unused._M_object = ftxui::bold;
  pcStack_5a0 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_invoke;
  local_5a8 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
              ::_M_manager;
  ftxui::Color::Color(&local_5fc,Chartreuse1);
  ftxui::color(local_5fc);
  ftxui::operator|((Decorator *)&local_4a8,(Decorator *)&local_5b8,(Decorator *)&local_398);
  ftxui::Color::Color(&local_600,Black);
  ftxui::bgcolor(local_600);
  ftxui::operator|((Decorator *)&local_378,(Decorator *)&local_4a8,(Decorator *)&local_3b8);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::operator=
            (&local_270.style_selected,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_378);
  if (local_368[0] != (_Manager_type)0x0) {
    (*local_368[0])(&local_378,&local_378,__destroy_functor);
  }
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
  }
  if (local_498 != (code *)0x0) {
    (*local_498)(&local_4a8,&local_4a8,__destroy_functor);
  }
  if (local_388 != (code *)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  if (local_5a8 != (_Manager_type)0x0) {
    (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
  }
  ftxui::Color::Color(&local_604,Black);
  ftxui::color(local_604);
  ftxui::Color::Color(&local_608,Chartreuse1);
  ftxui::bgcolor(local_608);
  ftxui::operator|((Decorator *)&local_378,(Decorator *)&local_3d8,(Decorator *)&local_3f8);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::operator=
            (&local_270.style_focused,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_378);
  if (local_368[0] != (_Manager_type)0x0) {
    (*local_368[0])(&local_378,&local_378,__destroy_functor);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  local_578.super__Function_base._M_functor._8_8_ = 0;
  local_578.super__Function_base._M_functor._M_unused._M_object = ftxui::bold;
  local_578._M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_invoke;
  local_578.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  ftxui::Color::Color(&local_60c,Black);
  ftxui::color(local_60c);
  ftxui::operator|((Decorator *)&local_418,&local_578,(Decorator *)&local_438);
  ftxui::Color::Color(&local_610,Chartreuse1);
  ftxui::bgcolor(local_610);
  ftxui::operator|((Decorator *)&local_378,(Decorator *)&local_418,(Decorator *)&local_458);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::operator=
            (&local_270.style_selected_focused,
             (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_378);
  if (local_368[0] != (_Manager_type)0x0) {
    (*local_368[0])(&local_378,&local_378,__destroy_functor);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,__destroy_functor);
  }
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,__destroy_functor);
  }
  if (local_578.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_578.super__Function_base._M_manager)
              ((_Any_data *)&local_578,(_Any_data *)&local_578,__destroy_functor);
  }
  if (local_658.
      super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_658.
      super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar21 = 0;
    do {
      local_4b8 = uVar21 * 3;
      pp_Var4 = local_638->_vptr__Sp_counted_base;
      lVar22 = *(long *)local_640;
      local_618 = uVar21;
      ftxui::MenuOption::MenuOption(&local_1a0,&local_270);
      ftxui::MenuOption::MenuOption((MenuOption *)&local_378,&local_1a0);
      local_2a8 = 0;
      entries.ref_wide_ =
           (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)(pp_Var4 + uVar21 * 3);
      entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_6e8;
      ftxui::Menu(entries,(int *)0x0,(Ref<ftxui::MenuOption> *)(lVar22 + uVar21 * 4));
      uVar10 = local_6e8._8_8_;
      uVar9 = local_6e8._M_unused._0_8_;
      local_630 = local_618 * 0x10;
      local_6e8._M_unused._M_object = (void *)0x0;
      local_6e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (*(long *)local_690 + 8 + local_630);
      puVar1 = (undefined8 *)(*(long *)local_690 + local_630);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_);
      }
      ftxui::MenuOption::~MenuOption((MenuOption *)&local_378);
      ftxui::MenuOption::~MenuOption(&local_1a0);
      local_488.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_488.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_488.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ftxui::Container::Tab
                ((Container *)local_6e8._M_pod_data,&local_488,
                 (int *)(uVar21 * 4 + *(long *)local_640));
      uVar10 = local_6e8._8_8_;
      uVar9 = local_6e8._M_unused._0_8_;
      local_6e8._M_unused._M_object = (ComponentBase *)0x0;
      local_6e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)local_660->_vptr__Sp_counted_base + local_630 + 8);
      puVar1 = (undefined8 *)((long)local_660->_vptr__Sp_counted_base + local_630);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_);
      }
      std::
      vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ::~vector(&local_488);
      *(undefined4 *)(*(long *)local_640 + local_618 * 4) = 0;
      local_4c8 = local_618 * 0x38;
      psVar24 = local_658.
                super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                ._M_impl.super__Vector_impl_data._M_start[local_618].groups.
                super__Vector_base<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_4c0 = local_658.
                  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_618].groups.
                  super__Vector_base<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar24 != local_4c0) {
        do {
          peVar6 = (psVar24->super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var5 = (psVar24->super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          pp_Var4 = local_638->_vptr__Sp_counted_base;
          (*(peVar6->super_ComponentBase)._vptr_ComponentBase[7])(&local_6e8,peVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pp_Var4 + local_4b8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6e8
                    );
          if ((ComponentBase *)local_6e8._M_unused._0_8_ != (ComponentBase *)local_6d8) {
            operator_delete(local_6e8._M_unused._M_object,
                            (ulong)((long)&((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_6d8._0_8_)->_M_ptr + 1));
          }
          pCVar7 = *(ComponentBase **)((long)local_660->_vptr__Sp_counted_base + local_630);
          p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
          p_Var20->_M_use_count = 1;
          p_Var20->_M_weak_count = 1;
          p_Var20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00174cd8;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          p_Var20[2]._M_use_count = 0;
          p_Var20[2]._M_weak_count = 0;
          p_Var20[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var20[1]._M_use_count = 0;
          p_Var20[1]._M_weak_count = 0;
          p_Var20[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var20[1]._vptr__Sp_counted_base = (_func_int **)&PTR__PanelAdapter_00174d28;
          p_Var20[3]._M_use_count = 0;
          p_Var20[3]._M_weak_count = 0;
          p_Var20[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          *(element_type **)&p_Var20[4]._M_use_count = peVar6;
          p_Var20[5]._vptr__Sp_counted_base = (_func_int **)p_Var5;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          this_00 = (ComponentBase *)(p_Var20 + 1);
          local_6e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6d8._8_8_ =
               std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:19:23)>
               ::_M_invoke;
          local_6d8._0_8_ =
               std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:19:23)>
               ::_M_manager;
          local_6e8._M_unused._M_object = this_00;
          local_4b0 = pCVar7;
          ftxui::Renderer((ftxui *)(local_6d8 + 0x20),
                          (function<std::shared_ptr<ftxui::Node>_(bool)> *)&local_6e8);
          p_Var14 = p_Stack_6b0;
          auVar12 = local_6b8;
          local_6b8 = (undefined1  [8])0x0;
          auVar13 = local_6b8;
          p_Stack_6b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[4]._vptr__Sp_counted_base;
          local_6b8._0_4_ = auVar12._0_4_;
          local_6b8._4_4_ = auVar12._4_4_;
          p_Var20[3]._M_use_count = local_6b8._0_4_;
          p_Var20[3]._M_weak_count = local_6b8._4_4_;
          p_Var20[4]._vptr__Sp_counted_base = (_func_int **)p_Var14;
          local_6b8 = auVar13;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_6b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6b0);
          }
          if ((pointer)local_6d8._0_8_ != (pointer)0x0) {
            (*(code *)local_6d8._0_8_)(&local_6e8,&local_6e8,3);
          }
          local_6b8 = *(undefined1 (*) [8])&p_Var20[3]._M_use_count;
          p_Stack_6b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        p_Var20[4]._vptr__Sp_counted_base;
          if (p_Stack_6b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)p_Stack_6b0 + 8) = *(int *)((long)p_Stack_6b0 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)p_Stack_6b0 + 8) = *(int *)((long)p_Stack_6b0 + 8) + 1;
            }
          }
          local_6a8 = *(code **)&p_Var20[4]._M_use_count;
          pp_Stack_6a0 = p_Var20[5]._vptr__Sp_counted_base;
          if (pp_Stack_6a0 != (_func_int **)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(pp_Stack_6a0 + 1) = *(int *)(pp_Stack_6a0 + 1) + 1;
              UNLOCK();
            }
            else {
              *(int *)(pp_Stack_6a0 + 1) = *(int *)(pp_Stack_6a0 + 1) + 1;
            }
          }
          __l_02._M_len = 2;
          __l_02._M_array = (iterator)(local_6d8 + 0x20);
          std::
          vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
          ::vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                    *)&local_688,__l_02,(allocator_type *)&local_470);
          ftxui::Container::Vertical((Container *)local_5d8._M_pod_data,(Components *)&local_688);
          ftxui::ComponentBase::Add(this_00,(Component *)&local_5d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d8._8_8_);
          }
          std::
          vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
          ::~vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                     *)&local_688);
          lVar22 = 0x20;
          do {
            if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_6d8 + lVar22 + 0x18) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          (local_6d8 + lVar22 + 0x18));
            }
            lVar22 = lVar22 + -0x10;
          } while (lVar22 != 0);
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          local_4d8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               this_00;
          local_4d8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = p_Var20;
          ftxui::ComponentBase::Add(local_4b0,&local_4d8);
          if (local_4d8.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4d8.
                       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          psVar24 = psVar24 + 1;
        } while (psVar24 != local_4c0);
      }
      lVar22 = *(long *)((long)&((local_658.
                                  super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->title)._M_dataplus.
                                _M_p + local_4c8);
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,lVar22,
                 *(long *)((long)&((local_658.
                                    super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->title).
                                  _M_string_length + local_4c8) + lVar22);
      pCVar7 = *(ComponentBase **)(*(long *)local_690 + local_630);
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (*(long *)local_690 + 8 + local_630);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6e8
                     ,anon_var_dwarf_110ad3,&local_598);
      std::__cxx11::string::operator=((string *)&local_598,(string *)local_6e8._M_pod_data);
      if ((ComponentBase *)local_6e8._M_unused._0_8_ != (ComponentBase *)local_6d8) {
        operator_delete(local_6e8._M_unused._M_object,
                        (ulong)((long)&((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)local_6d8._0_8_)->_M_ptr + 1));
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      local_6e8._M_unused._M_object = (ComponentBase *)local_6d8;
      local_688._M_unused._M_object = pCVar7;
      local_688._8_8_ = p_Var5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6e8,local_598._M_dataplus._M_p,
                 local_598._M_dataplus._M_p + local_598._M_string_length);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      local_6a8 = (code *)0x0;
      pp_Stack_6a0 = (_func_int **)0x0;
      local_6b8 = (undefined1  [8])0x0;
      p_Stack_6b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6d8._16_8_ = pCVar7;
      local_6d8._24_8_ = p_Var5;
      local_6b8 = (undefined1  [8])operator_new(0x30);
      uVar9 = local_6d8._24_8_;
      ppsVar8 = &(((ComponentBase *)local_6b8)->children_).
                 super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ((ComponentBase *)local_6b8)->_vptr_ComponentBase = (_func_int **)ppsVar8;
      if ((ComponentBase *)local_6e8._M_unused._0_8_ == (ComponentBase *)local_6d8) {
        *ppsVar8 = (pointer)local_6d8._0_8_;
        (((ComponentBase *)local_6b8)->children_).
        super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_6d8._8_8_;
      }
      else {
        ((ComponentBase *)local_6b8)->_vptr_ComponentBase = (_func_int **)local_6e8._M_unused._0_8_;
        (((ComponentBase *)local_6b8)->children_).
        super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6d8._0_8_;
      }
      (((ComponentBase *)local_6b8)->children_).
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6e8._8_8_;
      local_6e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6d8._0_8_ = local_6d8._0_8_ & 0xffffffffffffff00;
      ((ComponentBase *)local_6b8)->parent_ = (ComponentBase *)local_6d8._16_8_;
      ((ComponentBase *)((long)local_6b8 + 0x28))->_vptr_ComponentBase = (_func_int **)0x0;
      local_6d8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((ComponentBase *)((long)local_6b8 + 0x28))->_vptr_ComponentBase = (_func_int **)uVar9;
      local_6d8._16_8_ = (pointer)0x0;
      pp_Stack_6a0 = (_func_int **)
                     std::
                     _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:49:25)>
                     ::_M_invoke;
      local_6a8 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:49:25)>
                  ::_M_manager;
      local_6e8._M_unused._0_8_ = (ComponentBase *)local_6d8;
      ftxui::Renderer((ftxui *)local_5d8._M_pod_data,(Component *)&local_688,
                      (function<std::shared_ptr<ftxui::Node>_()> *)(local_6d8 + 0x20));
      if (local_6a8 != (code *)0x0) {
        (*local_6a8)((_Any_data *)(local_6d8 + 0x20),(_Any_data *)(local_6d8 + 0x20),
                     __destroy_functor);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._24_8_);
      }
      if ((ComponentBase *)local_6e8._M_unused._0_8_ != (ComponentBase *)local_6d8) {
        operator_delete(local_6e8._M_unused._M_object,
                        (ulong)((long)&((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)local_6d8._0_8_)->_M_ptr + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_);
      }
      uVar10 = local_5d8._8_8_;
      uVar9 = local_5d8._M_unused._0_8_;
      local_5d8._M_unused._M_object = (void *)0x0;
      local_5d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (*(long *)local_690 + 8 + local_630);
      puVar1 = (undefined8 *)(*(long *)local_690 + local_630);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5d8._8_8_);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      uVar21 = local_618 + 1;
    } while (uVar21 < (ulong)(((long)local_658.
                                     super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_658.
                                     super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_470,
           (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)local_690);
  ftxui::Container::Vertical((Container *)local_6e8._M_pod_data,&local_470,&p_Var19[9]._M_use_count)
  ;
  uVar10 = local_6e8._8_8_;
  uVar9 = local_6e8._M_unused._0_8_;
  local_6e8._M_unused._M_object = (_func_int **)0x0;
  local_6e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar11 = local_6e8._8_8_;
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var19[10]._M_use_count;
  p_Var19[10]._vptr__Sp_counted_base = (_func_int **)uVar9;
  local_6e8._8_4_ = (undefined4)uVar10;
  local_6e8._12_4_ = SUB84(uVar10,4);
  p_Var19[10]._M_use_count = local_6e8._8_4_;
  p_Var19[10]._M_weak_count = local_6e8._12_4_;
  local_6e8._8_8_ = uVar11;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_470);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_288,
           (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)local_660);
  ftxui::Container::Tab((Container *)local_6e8._M_pod_data,&local_288,&p_Var19[9]._M_use_count);
  uVar10 = local_6e8._8_8_;
  uVar9 = local_6e8._M_unused._0_8_;
  local_6e8._M_unused._M_object = (undefined1 *)0x0;
  local_6e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar11 = local_6e8._8_8_;
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var19[0xb]._M_use_count;
  p_Var19[0xb]._vptr__Sp_counted_base = (_func_int **)uVar9;
  local_6e8._8_4_ = (undefined4)uVar10;
  local_6e8._12_4_ = SUB84(uVar10,4);
  p_Var19[0xb]._M_use_count = local_6e8._8_4_;
  p_Var19[0xb]._M_weak_count = local_6e8._12_4_;
  local_6e8._8_8_ = uVar11;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6e8._8_8_);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_288);
  ftxui::ConstStringRef::ConstStringRef((ConstStringRef *)&local_6e8,"[Exit]");
  ftxui::ScreenInteractive::ExitLoopClosure(&local_d0);
  option.address_ = (ButtonOption *)0x0;
  option._0_8_ = local_6d8 + 0x20;
  ftxui::Button((ConstStringRef *)&local_688,(function<void_()> *)&local_6e8,option);
  uVar10 = local_688._8_8_;
  uVar9 = local_688._M_unused._0_8_;
  local_688._M_unused._M_object = (void *)0x0;
  local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar11 = local_688._8_8_;
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var19[0xc]._M_use_count;
  p_Var19[0xc]._vptr__Sp_counted_base = (_func_int **)uVar9;
  local_688._8_4_ = (undefined4)uVar10;
  local_688._12_4_ = SUB84(uVar10,4);
  p_Var19[0xc]._M_use_count = local_688._8_4_;
  p_Var19[0xc]._M_weak_count = local_688._12_4_;
  local_688._8_8_ = uVar11;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_);
  }
  if (local_6a8 != (code *)0x0) {
    (*local_6a8)((_Any_data *)(local_6d8 + 0x20),(_Any_data *)(local_6d8 + 0x20),__destroy_functor);
  }
  if ((undefined1 *)local_6e8._M_unused._0_8_ != local_6d8) {
    operator_delete(local_6e8._M_unused._M_object,
                    (ulong)((long)&((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_6d8._0_8_)->_M_ptr + 1));
  }
  local_688._M_unused._M_object = p_Var19[0xc]._vptr__Sp_counted_base;
  local_688._8_8_ = *(undefined8 *)&p_Var19[0xc]._M_use_count;
  if (local_688._8_8_ != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_688._8_8_ + 8) = *(int *)(local_688._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_688._8_8_ + 8) = *(int *)(local_688._8_8_ + 8) + 1;
    }
  }
  local_678 = p_Var19[10]._vptr__Sp_counted_base;
  pcStack_670 = *(code **)&p_Var19[10]._M_use_count;
  if (pcStack_670 != (code *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)pcStack_670 + 8) = *(int *)((long)pcStack_670 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)((long)pcStack_670 + 8) = *(int *)((long)pcStack_670 + 8) + 1;
    }
  }
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_688;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_2a0,__l_03,(allocator_type *)local_5d8._M_pod_data);
  ftxui::Container::Vertical((Container *)&local_4e8,&local_2a0);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_2a0);
  lVar22 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_690 + lVar22) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_690 + lVar22));
    }
    lVar22 = lVar22 + -0x10;
  } while (lVar22 != 0);
  local_508.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4e8;
  local_508.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_4e0;
  if (local_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_4e0->_M_use_count = local_4e0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_4e0->_M_use_count = local_4e0->_M_use_count + 1;
    }
  }
  local_688._8_8_ = 0;
  local_688._M_unused._M_object = local_668;
  pcStack_670 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:108:51)>
                ::_M_invoke;
  local_678 = (_func_int **)
              std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:108:51)>
              ::_M_manager;
  ftxui::Renderer((ftxui *)&local_4f8,&local_508,
                  (function<std::shared_ptr<ftxui::Node>_()> *)&local_688);
  if (local_678 != (_func_int **)0x0) {
    (*(code *)local_678)(&local_688,&local_688,3);
  }
  if (local_508.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_508.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p_Var19[0xb]._vptr__Sp_counted_base;
  local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var19[0xb]._M_use_count;
  if (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_5d8._8_8_ = 0;
  local_5d8._M_unused._M_object = local_668;
  pcStack_5c0 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:121:30)>
                ::_M_invoke;
  local_5c8 = std::
              _Function_handler<std::shared_ptr<ftxui::Node>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/ui.cpp:121:30)>
              ::_M_manager;
  ftxui::Renderer((ftxui *)&local_518,&local_528,
                  (function<std::shared_ptr<ftxui::Node>_()> *)&local_5d8);
  if (local_5c8 != (code *)0x0) {
    (*local_5c8)(&local_5d8,&local_5d8,__destroy_functor);
  }
  if (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_528.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_538.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4f8;
  local_538.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_4f0;
  if (local_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_4f0->_M_use_count = local_4f0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_4f0->_M_use_count = local_4f0->_M_use_count + 1;
    }
  }
  local_548.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_518;
  local_548.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_510;
  if (local_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_510->_M_use_count = local_510->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_510->_M_use_count = local_510->_M_use_count + 1;
    }
  }
  ftxui::ResizableSplitLeft((ftxui *)&local_628,&local_538,&local_548,(int *)(p_Var19 + 0xd));
  _Var16._M_pi = local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  peVar15 = local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[0xe]._vptr__Sp_counted_base;
  *(element_type **)&p_Var19[0xd]._M_use_count = peVar15;
  p_Var19[0xe]._vptr__Sp_counted_base = (_func_int **)_Var16._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_548.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_548.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_538.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_538.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&p_Var19[0xd]._M_use_count;
  local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[0xe]._vptr__Sp_counted_base;
  if (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ftxui::ComponentBase::Add(local_668,&local_628);
  if (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_628.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_510);
  }
  if (local_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0);
  }
  if (local_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0);
  }
  ftxui::MenuOption::~MenuOption(&local_270);
  std::vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
  ~vector(&local_658);
  local_558.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_668;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
  }
  local_558.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var19;
  ftxui::ScreenInteractive::Loop(&local_d0,&local_558);
  if (local_558.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_558.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
  std::vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
  ~vector(&local_5f8);
  ftxui::ScreenInteractive::~ScreenInteractive(&local_d0);
  return;
}

Assistant:

void Loop() {
  auto screen = ScreenInteractive::Fullscreen();
  std::vector<Group> groups = {
      {"System",
       {
           panel::PRU(), panel::GPIO(), panel::EMMC(), panel::Led(),
           panel::passwd(), panel::ssh(),
           // TODO: panel::PlaceHolder("Sensor Stats and Configurations "),
           // TODO: panel::PlaceHolder("Firmware Update"),
           // TODO: panel::PlaceHolder("SSH"),
       }},
      {"Network",
       {
           panel::WiFi(&screen),
           panel::ICS(),
       }},
      {"Info",
       {
           // TODO: panel::PlaceHolder("Update"),
           panel::About(),
       }},
  };

  Component main_menu = Make<MainMenu>(std::move(groups), &screen);
  screen.Loop(main_menu);
}